

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O1

void __thiscall HostVector_copy_constructor_Test::TestBody(HostVector_copy_constructor_Test *this)

{
  bool bVar1;
  int iVar2;
  int i;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  AssertionResult gtest_ar;
  HostVector<float> v2;
  HostVector<float> v1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertHelper local_88;
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelperData *local_70;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  ulong uStack_60;
  Array<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_50;
  
  iVar2 = posix_memalign(&local_70,8,400);
  lVar3 = 0;
  local_50.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_ =
       (pointer)(AssertHelperData *)0x0;
  if (iVar2 == 0) {
    local_50.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_ = (pointer)local_70;
  }
  local_50.super_ArrayView<float,_memory::HostCoordinator<float>_>.size_ = 100;
  do {
    (&((AssertHelperData *)local_50.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_
      )->type)[lVar3] = (Type)(float)(int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
  ::
  Array<memory::Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>&,void>
            ((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
              *)&local_70,&local_50);
  local_90.ptr_ = local_68;
  local_88.data_ =
       (AssertHelperData *)local_50.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_
  ;
  testing::internal::CmpHelperNE<float*,float*>
            (local_80,"v2.data()","v1.data()",(float **)&local_90,(float **)&local_88);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
               ,0x4d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_90.ptr_ + 8))();
      }
      local_90.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar3 = 0;
  uVar5 = 0;
  do {
    if ((local_50.super_ArrayView<float,_memory::HostCoordinator<float>_>.size_ <= uVar5) ||
       (uStack_60 <= uVar5)) {
      __assert_fail("i<size_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                    ,0x186,
                    "reference memory::ArrayViewImpl<memory::ArrayReference<float, memory::HostCoordinator<float>>, float, memory::HostCoordinator<float>>::operator[](size_type) [R = memory::ArrayReference<float, memory::HostCoordinator<float>>, T = float, Coord = memory::HostCoordinator<float>]"
                   );
    }
    testing::internal::CmpHelperEQ<float,float>
              (local_80,"v1[i]","v2[i]",
               (float *)((long)(Type *)local_50.
                                       super_ArrayView<float,_memory::HostCoordinator<float>_>.
                                       pointer_ + lVar3),(float *)(local_68 + lVar3));
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_90);
      pcVar4 = "";
      if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x51,pcVar4);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_90.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_90.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_90.ptr_ + 8))();
        }
        local_90.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar5 = uVar5 + 1;
    lVar3 = lVar3 + 4;
  } while (uVar5 != 100);
  if (local_68 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    free(local_68);
  }
  local_68 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uStack_60 = 0;
  if ((AssertHelperData *)local_50.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_
      != (AssertHelperData *)0x0) {
    free(local_50.super_ArrayView<float,_memory::HostCoordinator<float>_>.pointer_);
  }
  return;
}

Assistant:

TEST(HostVector, copy_constructor) {
    using namespace memory;

    // length constructor
    HostVector<float> v1(100);

    // initialize values as monotone sequence
    for(int i=0; i<v1.size(); ++i)
        v1[i] = float(i);

    // copy constructor
    //HostVector<float> v2;
    //v2 = v1;
    HostVector<float> v2 = v1;

    // ensure that new memory was allocated
    EXPECT_NE(v2.data(), v1.data());

    // check that v3 has values originally copied over from v1
    for(int i=0; i<100; i++)
        EXPECT_EQ(v1[i], v2[i]);
}